

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

SearchResult __thiscall
gss::innards::HomomorphismSearcher::restarting_search
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments,Domains *domains,
          unsigned_long_long *nodes,unsigned_long_long *propagations,loooong *solution_count,
          int depth,RestartsSchedule *restarts_schedule)

{
  pointer *ppHVar1;
  undefined1 *puVar2;
  BitWord *pBVar3;
  Proof *pPVar4;
  pointer pHVar5;
  BitWord BVar6;
  pointer pHVar7;
  byte bVar8;
  int iVar9;
  pointer ppVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  SearchResult SVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  HomomorphismDomain *pHVar16;
  HomomorphismParams *pHVar17;
  undefined8 uVar18;
  uint uVar19;
  int iVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  int iVar22;
  ulong uVar23;
  uint *puVar24;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1_1;
  uint *puVar25;
  ulong uVar26;
  pointer pHVar27;
  iterator iVar28;
  HomomorphismSearcher *pHVar29;
  Lackey *this_00;
  ulong uVar30;
  uint uVar31;
  pointer pHVar32;
  undefined1 *puVar33;
  long lVar34;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  uint __len;
  long lVar35;
  bool bVar36;
  string __str;
  undefined8 uStack_198;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  int local_16c;
  vector<int,_std::allocator<int>_> branch_v;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  proof_domains;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  HomomorphismSearcher *local_118;
  Domains *local_110;
  uint local_104;
  loooong *local_100;
  unsigned_long_long *local_f8;
  unsigned_long_long *local_f0;
  SVOBitset remaining;
  Domains new_domains;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110 = domains;
  local_100 = solution_count;
  local_f8 = nodes;
  local_f0 = propagations;
  if (pPVar4 != (Proof *)0x0) {
    bVar12 = Proof::super_extra_verbose(pPVar4);
    if (bVar12) {
      proof_domains.
      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      proof_domains.
      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      proof_domains.
      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pHVar32 = (local_110->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pHVar5 = (local_110->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar32 != pHVar5) {
        puVar2 = (undefined1 *)((long)&__str.field_2 + 8);
        do {
          puVar33 = (undefined1 *)((long)&remaining._data + 0x18);
          HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&__str,this->model,pHVar32->v);
          remaining._data.short_data[0]._0_4_ = (uint)__str._M_dataplus._M_p;
          remaining._data.short_data[1] = __str._M_string_length;
          if ((undefined1 *)__str._M_string_length == puVar2) {
            remaining._data.short_data[4] = uStack_198;
            remaining._data.short_data[1] = (BitWord)puVar33;
          }
          remaining._data.short_data[3] = __str.field_2._8_8_;
          remaining._data.short_data[2] =
               CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                        __str.field_2._M_allocated_capacity._0_4_);
          branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          __str.field_2._M_allocated_capacity._0_4_ = 0;
          __str.field_2._M_allocated_capacity._4_4_ = 0;
          __str.field_2._8_8_ = __str.field_2._8_8_ & 0xffffffffffffff00;
          remaining._data.short_data[7] = 0;
          remaining._data.short_data[5] = 0;
          remaining._data.short_data[6] = 0;
          branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          __str._M_string_length = (size_type)puVar2;
          std::
          vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
          ::
          emplace_back<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>
                    ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                      *)&proof_domains,
                     (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&remaining);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)&remaining._data + 0x28));
          if ((undefined1 *)remaining._data.short_data[1] != puVar33) {
            operator_delete((void *)remaining._data.short_data[1],remaining._data.short_data[3] + 1)
            ;
          }
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&branch_v);
          if ((undefined1 *)__str._M_string_length != puVar2) {
            operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
          }
          SVOBitset::SVOBitset(&remaining,&pHVar32->values);
          uVar23 = (ulong)remaining.n_words;
          uVar18 = &remaining;
          if (0x10 < uVar23) {
            uVar18 = remaining._data.short_data[0];
          }
          if (uVar23 != 0) {
            iVar22 = 0;
            uVar26 = 0;
LAB_00138074:
            BVar6 = (((SVOBitset *)uVar18)->_data).short_data[uVar26];
            if (BVar6 == 0) goto code_r0x0013807d;
            iVar20 = 0;
            for (; (BVar6 & 1) == 0; BVar6 = BVar6 >> 1 | 0x8000000000000000) {
              iVar20 = iVar20 + 1;
            }
            if (iVar20 + 1 == iVar22) {
LAB_00138096:
              if (remaining._data.short_data[0] != 0 && 0x10 < remaining.n_words) {
                operator_delete__(remaining._data.long_data);
              }
              goto LAB_001380ae;
            }
            iVar20 = iVar20 - iVar22;
            while( true ) {
              ppVar10 = proof_domains.
                        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar18 = remaining._data.short_data[0];
              if ((uint)uVar23 < 0x11) {
                uVar18 = &remaining;
              }
              bVar8 = (byte)iVar20 & 0x3f;
              iVar22 = iVar20 + 0x3f;
              if (-1 < iVar20) {
                iVar22 = iVar20;
              }
              (((SVOBitset *)uVar18)->_data).short_data[iVar22 >> 6] =
                   (((SVOBitset *)uVar18)->_data).short_data[iVar22 >> 6] &
                   (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                        ((NamedVertex *)&__str,this->model,iVar20);
              std::
              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              ::emplace_back<std::pair<int,std::__cxx11::string>>
                        ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                          *)&ppVar10[-1].second,(NamedVertex *)&__str);
              if ((undefined1 *)__str._M_string_length != puVar2) {
                operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
              }
              uVar23 = (ulong)remaining.n_words;
              uVar18 = &remaining;
              if (0x10 < uVar23) {
                uVar18 = remaining._data.short_data[0];
              }
              if (uVar23 == 0) break;
              iVar22 = 0;
              uVar26 = 0;
              while (BVar6 = (((SVOBitset *)uVar18)->_data).short_data[uVar26], BVar6 == 0) {
                uVar26 = uVar26 + 1;
                iVar22 = iVar22 + -0x40;
                if (uVar23 == uVar26) goto LAB_00138096;
              }
              iVar9 = 0;
              for (; (BVar6 & 1) == 0; BVar6 = BVar6 >> 1 | 0x8000000000000000) {
                iVar9 = iVar9 + 1;
              }
              iVar20 = iVar9 - iVar22;
              if (iVar9 + 1 == iVar22) goto LAB_00138096;
            }
          }
LAB_001380ae:
          pHVar32 = pHVar32 + 1;
        } while (pHVar32 != pHVar5);
      }
      __len = 1;
      uVar31 = -depth;
      if (0 < depth) {
        uVar31 = depth;
      }
      if (9 < uVar31) {
        uVar23 = (ulong)uVar31;
        uVar11 = 4;
        do {
          __len = uVar11;
          uVar19 = (uint)uVar23;
          if (uVar19 < 100) {
            __len = __len - 2;
            goto LAB_00138200;
          }
          if (uVar19 < 1000) {
            __len = __len - 1;
            goto LAB_00138200;
          }
          if (uVar19 < 10000) goto LAB_00138200;
          uVar23 = uVar23 / 10000;
          uVar11 = __len + 4;
        } while (99999 < uVar19);
        __len = __len + 1;
      }
LAB_00138200:
      pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&__str,(ulong)(__len + -(depth >> 0x1f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p + (uint)-(depth >> 0x1f),__len,uVar31);
      pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&__str,0,0,"entering depth ",0xf);
      pBVar3 = (BitWord *)((long)&remaining._data + 0x10);
      paVar21 = &pbVar15->field_2;
      remaining._data.short_data[0] = (BitWord)(pbVar15->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)remaining._data.short_data[0] == paVar21) {
        remaining._data.short_data[2] = paVar21->_M_allocated_capacity;
        remaining._data.short_data[3] = *(BitWord *)((long)&pbVar15->field_2 + 8);
        remaining._data.short_data[0] = (BitWord)pBVar3;
      }
      else {
        remaining._data.short_data[2] = paVar21->_M_allocated_capacity;
      }
      remaining._data.short_data[1] = pbVar15->_M_string_length;
      (pbVar15->_M_dataplus)._M_p = (pointer)paVar21;
      pbVar15->_M_string_length = 0;
      (pbVar15->field_2)._M_local_buf[0] = '\0';
      Proof::show_domains(pPVar4,(string *)&remaining,&proof_domains);
      if ((BitWord *)remaining._data.short_data[0] != pBVar3) {
        operator_delete(remaining._data.long_data,remaining._data.short_data[2] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,
                        CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                 __str.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~vector(&proof_domains);
    }
  }
  bVar12 = Timeout::should_abort
                     ((this->params->timeout).
                      super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar12) {
    return Aborted;
  }
  *local_f8 = *local_f8 + 1;
  pHVar16 = find_branch_domain(this,local_110);
  if (pHVar16 == (HomomorphismDomain *)0x0) {
    pHVar17 = this->params;
    this_00 = (pHVar17->lackey)._M_t.
              super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
              .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl;
    if (this_00 != (Lackey *)0x0) {
      remaining._data.short_data[3] = (BitWord)(&remaining._data.long_data + 1);
      remaining._data.short_data[1] = remaining._data.short_data[1] & 0xffffffff00000000;
      remaining._data.short_data[2] = 0;
      remaining._data.short_data[5] = 0;
      pHVar27 = (assignments->values).
                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar7 = (assignments->values).
               super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      remaining._data.short_data[4] = remaining._data.short_data[3];
      if (pHVar27 != pHVar7) {
        do {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&remaining,(uint *)pHVar27,&(pHVar27->assignment).target_vertex);
          pHVar27 = pHVar27 + 1;
        } while (pHVar27 != pHVar7);
        pHVar17 = this->params;
        this_00 = (pHVar17->lackey)._M_t.
                  super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                  .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl;
      }
      __str._M_dataplus._M_p = (pointer)0x0;
      __str._M_string_length._0_4_ = 0;
      __str._M_string_length._4_4_ = 0;
      __str.field_2._M_allocated_capacity._0_4_ = 0;
      __str.field_2._M_allocated_capacity._4_4_ = 0;
      __str.field_2._8_8_ = 0;
      bVar12 = Lackey::check_solution
                         (this_00,(VertexToVertexMapping *)&remaining,false,pHVar17->count_solutions
                          ,(function<bool_(int,_int)> *)&__str);
      if ((code *)CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                           __str.field_2._M_allocated_capacity._0_4_) != (code *)0x0) {
        (*(code *)CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                           __str.field_2._M_allocated_capacity._0_4_))(&__str,&__str,3);
      }
      if ((!bVar12) && (uVar23 = (ulong)this->params->propagate_using_lackey, uVar23 < 4)) {
        SVar14 = *(SearchResult *)(&DAT_001b0ff8 + uVar23 * 4);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&remaining);
        return SVar14;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&remaining);
    }
    pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar4 != (Proof *)0x0) {
      solution_in_proof_form_abi_cxx11_
                ((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&remaining,this,assignments);
      Proof::post_solution
                (pPVar4,(vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&remaining);
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&remaining);
    }
    if (this->params->count_solutions != true) {
      return Satisfiable;
    }
    if ((this->_duplicate_solution_filterer).super__Function_base._M_manager == (_Manager_type)0x0)
    {
      std::__throw_bad_function_call();
    }
    bVar12 = (*(this->_duplicate_solution_filterer)._M_invoker)
                       ((_Any_data *)&this->_duplicate_solution_filterer,assignments);
    if (bVar12) {
      boost::multiprecision::backends::
      eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                (&local_100->m_backend);
      pHVar17 = this->params;
      if ((pHVar17->enumerate_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        remaining._data.short_data[3] = (BitWord)(&remaining._data.long_data + 1);
        remaining._data.short_data[1] = remaining._data.short_data[1] & 0xffffffff00000000;
        remaining._data.short_data[2] = 0;
        remaining._data.short_data[5] = 0;
        pHVar27 = (assignments->values).
                  super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar7 = (assignments->values).
                 super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        remaining._data.short_data[4] = remaining._data.short_data[3];
        if (pHVar27 != pHVar7) {
          do {
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_emplace_unique<unsigned_int_const&,unsigned_int_const&>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)&remaining,(uint *)pHVar27,&(pHVar27->assignment).target_vertex);
            pHVar27 = pHVar27 + 1;
          } while (pHVar27 != pHVar7);
          pHVar17 = this->params;
          if ((pHVar17->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
        }
        bVar12 = (*(pHVar17->enumerate_callback)._M_invoker)
                           ((_Any_data *)&pHVar17->enumerate_callback,
                            (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&remaining);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&remaining);
        if (!bVar12) {
          return Satisfiable;
        }
      }
    }
    return SatisfiableButKeepGoing;
  }
  SVOBitset::SVOBitset(&remaining,&pHVar16->values);
  __last._M_current = (int *)(ulong)this->model->target_size;
  std::vector<int,_std::allocator<int>_>::vector
            (&branch_v,(size_type)__last._M_current,(allocator_type *)&__str);
  uVar23 = (ulong)remaining.n_words;
  uVar18 = &remaining;
  if (0x10 < uVar23) {
    uVar18 = remaining._data.short_data[0];
  }
  if (uVar23 == 0) {
LAB_001384ac:
    uVar31 = 0;
  }
  else {
    __last._M_current = (int *)0x0;
    uVar26 = 0;
LAB_00138395:
    BVar6 = (((SVOBitset *)uVar18)->_data).short_data[uVar26];
    iVar22 = (int)__last._M_current;
    if (BVar6 == 0) goto code_r0x001383a2;
    iVar20 = 0;
    for (; (BVar6 & 1) == 0; BVar6 = BVar6 >> 1 | 0x8000000000000000) {
      iVar20 = iVar20 + 1;
    }
    if (iVar20 + 1 == iVar22) goto LAB_001384ac;
    iVar20 = iVar20 - iVar22;
    uVar26 = 0;
    while( true ) {
      uVar18 = remaining._data.short_data[0];
      if ((uint)uVar23 < 0x11) {
        uVar18 = &remaining;
      }
      bVar8 = (byte)iVar20 & 0x3f;
      iVar22 = iVar20 + 0x3f;
      if (-1 < iVar20) {
        iVar22 = iVar20;
      }
      (((SVOBitset *)uVar18)->_data).short_data[iVar22 >> 6] =
           (((SVOBitset *)uVar18)->_data).short_data[iVar22 >> 6] &
           (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar26] = iVar20;
      uVar31 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar31;
      uVar23 = (ulong)remaining.n_words;
      uVar18 = &remaining;
      if (0x10 < uVar23) {
        uVar18 = remaining._data.short_data[0];
      }
      __last._M_current =
           branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      if (uVar23 == 0) break;
      iVar22 = 0;
      uVar30 = 0;
      while (BVar6 = (((SVOBitset *)uVar18)->_data).short_data[uVar30], BVar6 == 0) {
        uVar30 = uVar30 + 1;
        iVar22 = iVar22 + -0x40;
        if (uVar23 == uVar30) goto LAB_001384af;
      }
      iVar9 = 0;
      for (; (BVar6 & 1) == 0; BVar6 = BVar6 >> 1 | 0x8000000000000000) {
        iVar9 = iVar9 + 1;
      }
      iVar20 = iVar9 - iVar22;
      if (iVar9 + 1 == iVar22) break;
    }
  }
LAB_001384af:
  switch(this->params->value_ordering_heuristic) {
  case Biased:
    __last._M_current = (int *)&branch_v;
    softmax_shuffle(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar31);
    break;
  case Degree:
    bVar12 = false;
    goto LAB_00138642;
  case AntiDegree:
    bVar12 = true;
LAB_00138642:
    __last._M_current = (int *)&branch_v;
    degree_sort(this,(vector<int,_std::allocator<int>_> *)__last._M_current,uVar31,bVar12);
    break;
  case Random:
    __last._M_current =
         branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + uVar31;
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,__last,&this->global_rand);
  }
  local_16c = 0;
  local_104 = uVar31;
  if (uVar31 == 0) {
    SVar14 = Unsatisfiable;
    bVar12 = false;
  }
  else {
    lVar35 = (ulong)uVar31 << 2;
    bVar12 = false;
    bVar13 = false;
    iVar22 = depth + 2;
    local_118 = (HomomorphismSearcher *)(ulong)(depth + 1);
    puVar25 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar4 != (Proof *)0x0) {
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&__str,this->model,pHVar16->v);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&proof_domains,this->model,*puVar25);
        Proof::guessing(pPVar4,depth,(NamedVertex *)&__str,(NamedVertex *)&proof_domains);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)proof_domains.
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != &local_130) {
          operator_delete(proof_domains.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (ulong)(local_130._M_allocated_capacity + 1));
        }
        if ((void *)__str._M_string_length != (void *)((long)&__str.field_2 + 8)) {
          operator_delete((void *)__str._M_string_length,__str.field_2._8_8_ + 1);
        }
      }
      iVar28._M_current =
           (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lVar34 = (long)iVar28._M_current -
               (long)(assignments->values).
                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      __str._M_dataplus._M_p._4_4_ = *puVar25;
      __str._M_dataplus._M_p._0_4_ = pHVar16->v;
      __str._M_string_length._0_1_ = 1;
      __str._M_string_length._4_4_ = local_16c;
      __str.field_2._M_allocated_capacity._0_4_ = local_104;
      if (iVar28._M_current ==
          (assignments->values).
          super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
                  (&assignments->values,iVar28,(HomomorphismAssignmentInformation *)&__str);
      }
      else {
        (iVar28._M_current)->choice_count = local_104;
        (iVar28._M_current)->assignment = (HomomorphismAssignment)__str._M_dataplus._M_p;
        (iVar28._M_current)->is_decision = true;
        *(undefined3 *)&(iVar28._M_current)->field_0x9 = __str._M_string_length._1_3_;
        (iVar28._M_current)->discrepancy_count = local_16c;
        ppHVar1 = &(assignments->values).
                   super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      copy_nonfixed_domains_and_make_assignment
                (&new_domains,(HomomorphismSearcher *)iVar28._M_current,local_110,pHVar16->v,
                 *puVar25);
      *local_f0 = *local_f0 + 1;
      bVar36 = true;
      if (!bVar13) {
        bVar36 = this->params->propagate_using_lackey == Always;
      }
      pHVar29 = (HomomorphismSearcher *)0x0;
      bVar36 = propagate(this,false,&new_domains,assignments,bVar36);
      __last._M_current = (int *)((lVar34 >> 2) * -0x3333333333333333);
      pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar36) {
        if (pPVar4 != (Proof *)0x0) {
          Proof::start_level(pPVar4,iVar22);
        }
        pHVar29 = (HomomorphismSearcher *)assignments;
        SVar14 = restarting_search(this,assignments,&new_domains,local_f8,local_f0,local_100,
                                   (int)local_118,restarts_schedule);
        switch(SVar14) {
        case Aborted:
        case Satisfiable:
          std::
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          ::~vector(&new_domains);
          goto LAB_00138c82;
        case UnsatisfiableAndBackjumpUsingLackey:
          bVar13 = true;
        case Unsatisfiable:
          pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (pPVar4 != (Proof *)0x0) {
            pHVar29 = local_118;
            Proof::back_up_to_level(pPVar4,(int)local_118);
            pPVar4 = (this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            assignments_as_proof_decisions
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
                       pHVar29,assignments);
            Proof::incorrect_guess
                      (pPVar4,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &__str,true);
            if (__str._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(__str._M_dataplus._M_p,
                              CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                       __str.field_2._M_allocated_capacity._0_4_) -
                              (long)__str._M_dataplus._M_p);
            }
            Proof::forget_level((this->proof).
                                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,iVar22);
          }
          bVar12 = true;
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::resize(&assignments->values,(size_type)__last._M_current);
          pHVar29 = (HomomorphismSearcher *)__last._M_current;
          break;
        case SatisfiableButKeepGoing:
          pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (pPVar4 != (Proof *)0x0) {
            pHVar29 = local_118;
            Proof::back_up_to_level(pPVar4,(int)local_118);
            pPVar4 = (this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            assignments_as_proof_decisions
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
                       pHVar29,assignments);
            Proof::incorrect_guess
                      (pPVar4,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &__str,false);
            if (__str._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(__str._M_dataplus._M_p,
                              CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                                       __str.field_2._M_allocated_capacity._0_4_) -
                              (long)__str._M_dataplus._M_p);
            }
            Proof::forget_level((this->proof).
                                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,iVar22);
          }
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::resize(&assignments->values,(size_type)__last._M_current);
          pHVar29 = (HomomorphismSearcher *)__last._M_current;
          break;
        case Restart:
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::resize(&assignments->values,(size_type)__last._M_current);
          if (puVar25 !=
              (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
            iVar28._M_current =
                 (assignments->values).
                 super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            puVar24 = (uint *)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
            do {
              __str._M_dataplus._M_p._4_4_ = *puVar24;
              __str._M_dataplus._M_p._0_4_ = pHVar16->v;
              __str._M_string_length._0_1_ = 1;
              __str._M_string_length._4_4_ = -2;
              __str.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
              if (iVar28._M_current ==
                  (assignments->values).
                  super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                ::_M_realloc_insert<gss::innards::HomomorphismAssignmentInformation>
                          (&assignments->values,iVar28,(HomomorphismAssignmentInformation *)&__str);
              }
              else {
                (iVar28._M_current)->choice_count = -2;
                (iVar28._M_current)->assignment = (HomomorphismAssignment)__str._M_dataplus._M_p;
                (iVar28._M_current)->is_decision = true;
                *(undefined3 *)&(iVar28._M_current)->field_0x9 = __str._M_string_length._1_3_;
                (iVar28._M_current)->discrepancy_count = 0xfffffffe;
                ppHVar1 = &(assignments->values).
                           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
              }
              post_nogood(this,assignments);
              puVar24 = puVar24 + 1;
              iVar28._M_current =
                   (assignments->values).
                   super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              (assignments->values).
              super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar28._M_current;
            } while (puVar25 != puVar24);
          }
          std::
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          ::~vector(&new_domains);
          SVar14 = Restart;
          goto LAB_00138c82;
        }
        local_16c = local_16c + 1;
        __last._M_current = (int *)pHVar29;
      }
      else {
        if (pPVar4 != (Proof *)0x0) {
          assignments_as_proof_decisions(&local_48,pHVar29,assignments);
          HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&__str,this->model,pHVar16->v);
          HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                    ((NamedVertex *)&proof_domains,this->model,*puVar25);
          Proof::propagation_failure
                    (pPVar4,&local_48,(NamedVertex *)&__str,(NamedVertex *)&proof_domains);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)proof_domains.
                 super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish != &local_130) {
            operator_delete(proof_domains.
                            super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (ulong)(local_130._M_allocated_capacity + 1));
          }
          if ((void *)CONCAT44(__str._M_string_length._4_4_,(undefined4)__str._M_string_length) !=
              (void *)((long)&__str.field_2 + 8)) {
            operator_delete((void *)CONCAT44(__str._M_string_length._4_4_,
                                             (undefined4)__str._M_string_length),
                            __str.field_2._8_8_ + 1);
          }
          if (local_48.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        bVar12 = true;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize(&assignments->values,(size_type)__last._M_current);
      }
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      ~vector(&new_domains);
      puVar25 = puVar25 + 1;
      lVar35 = lVar35 + -4;
    } while (lVar35 != 0);
    SVar14 = bVar13 + Unsatisfiable;
  }
  pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pPVar4 != (Proof *)0x0) {
    assignments_as_proof_decisions
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str,
               (HomomorphismSearcher *)__last._M_current,assignments);
    Proof::out_of_guesses
              (pPVar4,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__str);
    if (__str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(__str._M_dataplus._M_p,
                      CONCAT44(__str.field_2._M_allocated_capacity._4_4_,
                               __str.field_2._M_allocated_capacity._0_4_) -
                      (long)__str._M_dataplus._M_p);
    }
  }
  if (bVar12) {
    (*restarts_schedule->_vptr_RestartsSchedule[2])();
  }
  iVar22 = (*restarts_schedule->_vptr_RestartsSchedule[4])();
  if ((char)iVar22 != '\0') {
    pPVar4 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar4 != (Proof *)0x0) {
      Proof::back_up_to_top(pPVar4);
    }
    SVar14 = Restart;
    post_nogood(this,assignments);
  }
LAB_00138c82:
  if (branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)branch_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((0x10 < remaining.n_words) && (remaining._data.short_data[0] != 0)) {
    operator_delete__(remaining._data.long_data);
  }
  return SVar14;
code_r0x0013807d:
  uVar26 = uVar26 + 1;
  iVar22 = iVar22 + -0x40;
  if (uVar23 == uVar26) goto LAB_00138096;
  goto LAB_00138074;
code_r0x001383a2:
  uVar26 = uVar26 + 1;
  __last._M_current = (int *)(ulong)(iVar22 - 0x40);
  if (uVar23 == uVar26) goto LAB_001384ac;
  goto LAB_00138395;
}

Assistant:

auto HomomorphismSearcher::restarting_search(
    HomomorphismAssignments & assignments,
    const Domains & domains,
    unsigned long long & nodes,
    unsigned long long & propagations,
    loooong & solution_count,
    int depth,
    RestartsSchedule & restarts_schedule) -> SearchResult
{
    if (proof && proof->super_extra_verbose()) {
        vector<pair<NamedVertex, vector<NamedVertex>>> proof_domains;
        for (auto & d : domains) {
            proof_domains.push_back(pair{model.pattern_vertex_for_proof(d.v), vector<NamedVertex>{}});
            auto values = d.values;
            for (auto v = values.find_first(); v != decltype(values)::npos; v = values.find_first()) {
                values.reset(v);
                proof_domains.back().second.push_back(model.target_vertex_for_proof(v));
            }
        }
        proof->show_domains("entering depth " + to_string(depth), proof_domains);
    }

    if (params.timeout->should_abort())
        return SearchResult::Aborted;

    ++nodes;

    // find ourselves a domain, or succeed if we're all assigned
    const HomomorphismDomain * branch_domain = find_branch_domain(domains);
    if (! branch_domain) {
        if (params.lackey) {
            VertexToVertexMapping mapping;
            expand_to_full_result(assignments, mapping);
            if (! params.lackey->check_solution(mapping, false, params.count_solutions, {})) {
                switch (params.propagate_using_lackey) {
                case PropagateUsingLackey::RootAndBackjump:
                    return SearchResult::UnsatisfiableAndBackjumpUsingLackey;
                case PropagateUsingLackey::Never:
                case PropagateUsingLackey::Root:
                case PropagateUsingLackey::Always:
                    return SearchResult::Unsatisfiable;
                }
            }
        }

        if (proof)
            proof->post_solution(solution_in_proof_form(assignments));

        if (params.count_solutions) {
            // we could be finding duplicate solutions, in threaded search
            if (_duplicate_solution_filterer(assignments)) {
                ++solution_count;
                if (params.enumerate_callback) {
                    VertexToVertexMapping mapping;
                    expand_to_full_result(assignments, mapping);
                    if (! params.enumerate_callback(mapping))
                        return SearchResult::Satisfiable;
                }
            }

            return SearchResult::SatisfiableButKeepGoing;
        }
        else
            return SearchResult::Satisfiable;
    }

    // pull out the remaining values in this domain for branching
    auto remaining = branch_domain->values;

    vector<int> branch_v(model.target_size);

    unsigned branch_v_end = 0;
    for (auto f_v = remaining.find_first(); f_v != decltype(remaining)::npos; f_v = remaining.find_first()) {
        remaining.reset(f_v);
        branch_v[branch_v_end++] = f_v;
    }

    switch (params.value_ordering_heuristic) {
    case ValueOrdering::None:
        break;

    case ValueOrdering::Degree:
        degree_sort(branch_v, branch_v_end, false);
        break;

    case ValueOrdering::AntiDegree:
        degree_sort(branch_v, branch_v_end, true);
        break;

    case ValueOrdering::Biased:
        softmax_shuffle(branch_v, branch_v_end);
        break;

    case ValueOrdering::Random:
        shuffle(branch_v.begin(), branch_v.begin() + branch_v_end, global_rand);
        break;
    }

    int discrepancy_count = 0;
    bool actually_hit_a_failure = false;

    // override whether we use the lackey for propagation, in case we are inside a backjump
    bool use_lackey_for_propagation = false;

    // for each value remaining...
    for (auto f_v = branch_v.begin(), f_end = branch_v.begin() + branch_v_end; f_v != f_end; ++f_v) {
        if (proof)
            proof->guessing(depth, model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

        // modified in-place by appending, we can restore by shrinking
        auto assignments_size = assignments.values.size();

        // make the assignment
        assignments.values.push_back({{branch_domain->v, unsigned(*f_v)}, true, discrepancy_count, int(branch_v_end)});

        // set up new domains
        Domains new_domains = copy_nonfixed_domains_and_make_assignment(domains, branch_domain->v, *f_v);

        // propagate
        ++propagations;
        if (! propagate(false, new_domains, assignments, use_lackey_for_propagation || (params.propagate_using_lackey == PropagateUsingLackey::Always))) {
            // failure? restore assignments and go on to the next thing
            if (proof)
                proof->propagation_failure(assignments_as_proof_decisions(assignments), model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;

            continue;
        }

        if (proof)
            proof->start_level(depth + 2);

        // recursive search
        auto search_result = restarting_search(assignments, new_domains, nodes, propagations,
            solution_count, depth + 1, restarts_schedule);

        switch (search_result) {
        case SearchResult::Satisfiable:
            return SearchResult::Satisfiable;

        case SearchResult::Aborted:
            return SearchResult::Aborted;

        case SearchResult::Restart:
            // restore assignments before posting nogoods, it's easier
            assignments.values.resize(assignments_size);

            // post nogoods for everything we've done so far
            for (auto l = branch_v.begin(); l != f_v; ++l) {
                assignments.values.push_back({{branch_domain->v, unsigned(*l)}, true, -2, -2});
                post_nogood(assignments);
                assignments.values.pop_back();
            }

            return SearchResult::Restart;

        case SearchResult::SatisfiableButKeepGoing:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), false);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            break;

        case SearchResult::UnsatisfiableAndBackjumpUsingLackey:
            use_lackey_for_propagation = true;
            [[std::fallthrough]];

        case SearchResult::Unsatisfiable:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), true);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;
            break;
        }

        ++discrepancy_count;
    }

    // no values remaining, backtrack, or possibly kick off a restart
    if (proof)
        proof->out_of_guesses(assignments_as_proof_decisions(assignments));

    if (actually_hit_a_failure)
        restarts_schedule.did_a_backtrack();

    if (restarts_schedule.should_restart()) {
        if (proof)
            proof->back_up_to_top();
        post_nogood(assignments);
        return SearchResult::Restart;
    }
    else
        return use_lackey_for_propagation ? SearchResult::UnsatisfiableAndBackjumpUsingLackey : SearchResult::Unsatisfiable;
}